

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# covscript.cpp
# Opt level: O2

context_t __thiscall cs::create_subcontext(cs *this,context_t *cxt)

{
  long lVar1;
  domain_manager *pdVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  context_t cVar3;
  any local_2f0;
  any local_2e8;
  any local_2e0;
  any local_2d8;
  any local_2d0;
  var local_2c8;
  var local_2c0;
  var local_2b8;
  var local_2b0;
  var local_2a8;
  var local_2a0;
  var local_298;
  any local_290;
  any local_288;
  types local_27c;
  undefined1 local_278 [16];
  code *local_268;
  code *local_260;
  __shared_ptr<cs::name_space,_(__gnu_cxx::_Lock_policy)2> local_258;
  __shared_ptr<cs::name_space,_(__gnu_cxx::_Lock_policy)2> local_248;
  __shared_ptr<cs::name_space,_(__gnu_cxx::_Lock_policy)2> local_238;
  __shared_ptr<cs::name_space,_(__gnu_cxx::_Lock_policy)2> local_228;
  __shared_ptr<cs::name_space,_(__gnu_cxx::_Lock_policy)2> local_218;
  __shared_ptr<cs::name_space,_(__gnu_cxx::_Lock_policy)2> local_208;
  __shared_ptr<cs::name_space,_(__gnu_cxx::_Lock_policy)2> local_1f8;
  type_index local_1e8;
  type_index local_1e0;
  type_index local_1d8;
  type_index local_1d0;
  type_index local_1c8;
  type_index local_1c0;
  type_index local_1b8;
  type_index local_1b0;
  type_index local_1a8;
  type_index local_1a0;
  type_index local_198;
  type_index local_190;
  _Any_data local_188;
  code *local_178;
  code *local_170;
  _Any_data local_168;
  code *local_158;
  code *local_150;
  _Any_data local_148;
  code *local_138;
  code *local_130;
  _Any_data local_128;
  code *local_118;
  code *local_110;
  _Any_data local_108;
  code *local_f8;
  code *local_f0;
  _Any_data local_e8;
  code *local_d8;
  code *local_d0;
  _Any_data local_c8;
  code *local_b8;
  code *local_b0;
  _Any_data local_a8;
  code *local_98;
  code *local_90;
  _Any_data local_88;
  code *local_78;
  code *local_70;
  _Any_data local_68;
  code *local_58;
  code *local_50;
  _Any_data local_48;
  code *local_38;
  code *local_30;
  
  cs_impl::init_extensions((cs_impl *)this);
  std::make_shared<cs::context_type>();
  std::
  make_shared<cs::instance_type,std::shared_ptr<cs::context_type>&,cs::stack_type<cs::domain_type,std::allocator>*&,unsigned_long&>
            ((shared_ptr<cs::context_type> *)local_278,
             (stack_type<cs::domain_type,_std::allocator> **)this,
             (unsigned_long *)
             &((((cxt->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
               instance).super___shared_ptr<cs::instance_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              fiber_sp);
  std::__shared_ptr<cs::instance_type,_(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<cs::instance_type,_(__gnu_cxx::_Lock_policy)2> *)(*(long *)this + 0x10),
             (__shared_ptr<cs::instance_type,_(__gnu_cxx::_Lock_policy)2> *)local_278);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_278 + 8));
  std::__shared_ptr<cs::compiler_type,_(__gnu_cxx::_Lock_policy)2>::operator=
            (*(__shared_ptr<cs::compiler_type,_(__gnu_cxx::_Lock_policy)2> **)this,
             (__shared_ptr<cs::compiler_type,_(__gnu_cxx::_Lock_policy)2> *)
             (cxt->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
  cs_impl::any::operator=
            ((any *)(*(long *)this + 0xb0),
             &((cxt->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
              cmd_args);
  lVar1 = *(long *)(*(long *)this + 0x10);
  local_278._0_8_ = (element_type *)0x0;
  local_278._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_260 = std::
              _Function_handler<cs_impl::any_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/sources/covscript.cpp:560:29)>
              ::_M_invoke;
  local_268 = std::
              _Function_handler<cs_impl::any_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/sources/covscript.cpp:560:29)>
              ::_M_manager;
  local_190._M_target = (type_info *)&char::typeinfo;
  std::__shared_ptr<cs::name_space,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_1f8,
             (__shared_ptr<cs::name_space,_(__gnu_cxx::_Lock_policy)2> *)&cs_impl::char_ext);
  pdVar2 = domain_manager::add_buildin_type<char_const(&)[5]>
                     ((domain_manager *)(lVar1 + 0x30),(char (*) [5])0x2fad98,
                      (function<cs_impl::any_()> *)local_278,&local_190,(namespace_t *)&local_1f8);
  local_48._M_unused._M_object = (void *)0x0;
  local_48._8_8_ = 0;
  local_30 = std::
             _Function_handler<cs_impl::any_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/sources/covscript.cpp:562:31)>
             ::_M_invoke;
  local_38 = std::
             _Function_handler<cs_impl::any_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/sources/covscript.cpp:562:31)>
             ::_M_manager;
  local_198._M_target = (type_info *)&numeric::typeinfo;
  pdVar2 = domain_manager::add_buildin_type<char_const(&)[7]>
                     (pdVar2,(char (*) [7])0x2f7997,(function<cs_impl::any_()> *)&local_48,
                      &local_198);
  local_68._M_unused._M_object = (void *)0x0;
  local_68._8_8_ = 0;
  local_50 = std::
             _Function_handler<cs_impl::any_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/sources/covscript.cpp:563:32)>
             ::_M_invoke;
  local_58 = std::
             _Function_handler<cs_impl::any_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/sources/covscript.cpp:563:32)>
             ::_M_manager;
  local_1a0._M_target = (type_info *)&numeric::typeinfo;
  pdVar2 = domain_manager::add_buildin_type<char_const(&)[8]>
                     (pdVar2,(char (*) [8])0x3092dc,(function<cs_impl::any_()> *)&local_68,
                      &local_1a0);
  local_88._M_unused._M_object = (void *)0x0;
  local_88._8_8_ = 0;
  local_70 = std::
             _Function_handler<cs_impl::any_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/sources/covscript.cpp:564:30)>
             ::_M_invoke;
  local_78 = std::
             _Function_handler<cs_impl::any_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/sources/covscript.cpp:564:30)>
             ::_M_manager;
  local_1a8._M_target = (type_info *)&numeric::typeinfo;
  pdVar2 = domain_manager::add_buildin_type<char_const(&)[6]>
                     (pdVar2,(char (*) [6])0x2f74d0,(function<cs_impl::any_()> *)&local_88,
                      &local_1a8);
  local_a8._M_unused._M_object = (void *)0x0;
  local_a8._8_8_ = 0;
  local_90 = std::
             _Function_handler<cs_impl::any_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/sources/covscript.cpp:565:32)>
             ::_M_invoke;
  local_98 = std::
             _Function_handler<cs_impl::any_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/sources/covscript.cpp:565:32)>
             ::_M_manager;
  local_1b0._M_target = (type_info *)&bool::typeinfo;
  pdVar2 = domain_manager::add_buildin_type<char_const(&)[8]>
                     (pdVar2,(char (*) [8])0x2fad8c,(function<cs_impl::any_()> *)&local_a8,
                      &local_1b0);
  local_c8._M_unused._M_object = (void *)0x0;
  local_c8._8_8_ = 0;
  local_b0 = std::
             _Function_handler<cs_impl::any_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/sources/covscript.cpp:566:32)>
             ::_M_invoke;
  local_b8 = std::
             _Function_handler<cs_impl::any_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/sources/covscript.cpp:566:32)>
             ::_M_manager;
  local_1b8._M_target = (type_info *)&pointer::typeinfo;
  pdVar2 = domain_manager::add_buildin_type<char_const(&)[8]>
                     (pdVar2,(char (*) [8])0x2f66b5,(function<cs_impl::any_()> *)&local_c8,
                      &local_1b8);
  local_e8._M_unused._M_object = (void *)0x0;
  local_e8._8_8_ = 0;
  local_d0 = std::
             _Function_handler<cs_impl::any_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/sources/covscript.cpp:567:31)>
             ::_M_invoke;
  local_d8 = std::
             _Function_handler<cs_impl::any_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/sources/covscript.cpp:567:31)>
             ::_M_manager;
  local_1c0._M_target = (type_info *)&std::__cxx11::string::typeinfo;
  std::__shared_ptr<cs::name_space,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_208,
             (__shared_ptr<cs::name_space,_(__gnu_cxx::_Lock_policy)2> *)&cs_impl::string_ext);
  pdVar2 = domain_manager::add_buildin_type<char_const(&)[7]>
                     (pdVar2,(char (*) [7])0x2f67a9,(function<cs_impl::any_()> *)&local_e8,
                      &local_1c0,(namespace_t *)&local_208);
  local_108._M_unused._M_object = (void *)0x0;
  local_108._8_8_ = 0;
  local_f0 = std::
             _Function_handler<cs_impl::any_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/sources/covscript.cpp:569:29)>
             ::_M_invoke;
  local_f8 = std::
             _Function_handler<cs_impl::any_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/sources/covscript.cpp:569:29)>
             ::_M_manager;
  local_1c8._M_target =
       (type_info *)&std::__cxx11::list<cs_impl::any,std::allocator<cs_impl::any>>::typeinfo;
  std::__shared_ptr<cs::name_space,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_218,
             (__shared_ptr<cs::name_space,_(__gnu_cxx::_Lock_policy)2> *)&cs_impl::list_ext);
  pdVar2 = domain_manager::add_buildin_type<char_const(&)[5]>
                     (pdVar2,(char (*) [5])0x2fad6f,(function<cs_impl::any_()> *)&local_108,
                      &local_1c8,(namespace_t *)&local_218);
  local_128._M_unused._M_object = (void *)0x0;
  local_128._8_8_ = 0;
  local_110 = std::
              _Function_handler<cs_impl::any_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/sources/covscript.cpp:570:30)>
              ::_M_invoke;
  local_118 = std::
              _Function_handler<cs_impl::any_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/sources/covscript.cpp:570:30)>
              ::_M_manager;
  local_1d0._M_target =
       (type_info *)&std::deque<cs_impl::any,std::allocator<cs_impl::any>>::typeinfo;
  std::__shared_ptr<cs::name_space,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_228,
             (__shared_ptr<cs::name_space,_(__gnu_cxx::_Lock_policy)2> *)&cs_impl::array_ext);
  pdVar2 = domain_manager::add_buildin_type<char_const(&)[6]>
                     (pdVar2,(char (*) [6])0x2fb98c,(function<cs_impl::any_()> *)&local_128,
                      &local_1d0,(namespace_t *)&local_228);
  local_148._M_unused._M_object = (void *)0x0;
  local_148._8_8_ = 0;
  local_130 = std::
              _Function_handler<cs_impl::any_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/sources/covscript.cpp:572:29)>
              ::_M_invoke;
  local_138 = std::
              _Function_handler<cs_impl::any_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/sources/covscript.cpp:572:29)>
              ::_M_manager;
  local_1d8._M_target = (type_info *)&std::pair<cs_impl::any,cs_impl::any>::typeinfo;
  std::__shared_ptr<cs::name_space,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_238,
             (__shared_ptr<cs::name_space,_(__gnu_cxx::_Lock_policy)2> *)&cs_impl::pair_ext);
  pdVar2 = domain_manager::add_buildin_type<char_const(&)[5]>
                     (pdVar2,(char (*) [5])0x30873d,(function<cs_impl::any_()> *)&local_148,
                      &local_1d8,(namespace_t *)&local_238);
  local_168._M_unused._M_object = (void *)0x0;
  local_168._8_8_ = 0;
  local_150 = std::
              _Function_handler<cs_impl::any_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/sources/covscript.cpp:574:33)>
              ::_M_invoke;
  local_158 = std::
              _Function_handler<cs_impl::any_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/sources/covscript.cpp:574:33)>
              ::_M_manager;
  local_1e0._M_target =
       (type_info *)
       &phmap::
        flat_hash_set<cs_impl::any,phmap::Hash<cs_impl::any>,phmap::EqualTo<cs_impl::any>,std::allocator<cs_impl::any>>
        ::typeinfo;
  std::__shared_ptr<cs::name_space,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_248,
             (__shared_ptr<cs::name_space,_(__gnu_cxx::_Lock_policy)2> *)&cs_impl::hash_set_ext);
  pdVar2 = domain_manager::add_buildin_type<char_const(&)[9]>
                     (pdVar2,(char (*) [9])0x2f9e34,(function<cs_impl::any_()> *)&local_168,
                      &local_1e0,(namespace_t *)&local_248);
  local_188._M_unused._M_object = (void *)0x0;
  local_188._8_8_ = 0;
  local_170 = std::
              _Function_handler<cs_impl::any_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/sources/covscript.cpp:576:33)>
              ::_M_invoke;
  local_178 = std::
              _Function_handler<cs_impl::any_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/sources/covscript.cpp:576:33)>
              ::_M_manager;
  local_1e8._M_target =
       (type_info *)
       &phmap::
        flat_hash_map<cs_impl::any,cs_impl::any,phmap::Hash<cs_impl::any>,phmap::EqualTo<cs_impl::any>,std::allocator<std::pair<cs_impl::any_const,cs_impl::any>>>
        ::typeinfo;
  std::__shared_ptr<cs::name_space,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_258,
             (__shared_ptr<cs::name_space,_(__gnu_cxx::_Lock_policy)2> *)&cs_impl::hash_map_ext);
  pdVar2 = domain_manager::add_buildin_type<char_const(&)[9]>
                     (pdVar2,(char (*) [9])0x2fad4d,(function<cs_impl::any_()> *)&local_188,
                      &local_1e8,(namespace_t *)&local_258);
  cs_impl::any::make_constant<std::shared_ptr<cs::context_type>,std::shared_ptr<cs::context_type>&>
            (&local_288,(shared_ptr<cs::context_type> *)this);
  pdVar2 = domain_manager::add_buildin_var<char_const(&)[8]>
                     (pdVar2,(char (*) [8])0x30c470,&local_288);
  local_27c = request_fold;
  cs_impl::any::
  make_protect<cs::callable,cs_impl::any(&)(std::vector<cs_impl::any,std::allocator<cs_impl::any>>&),cs::callable::types>
            (&local_290,range,&local_27c);
  pdVar2 = domain_manager::add_buildin_var<char_const(&)[6]>
                     (pdVar2,(char (*) [6])0x30bdf9,&local_290);
  make_cni<cs::numeric(&)(cs_impl::any_const&)>((cs *)&local_298,to_integer,true);
  pdVar2 = domain_manager::add_buildin_var<char_const(&)[11]>
                     (pdVar2,(char (*) [11])"to_integer",&local_298);
  make_cni<std::__cxx11::string(&)(cs_impl::any_const&)>((cs *)&local_2a0,to_string_abi_cxx11_,true)
  ;
  pdVar2 = domain_manager::add_buildin_var<char_const(&)[10]>
                     (pdVar2,(char (*) [10])"to_string",&local_2a0);
  make_cni<std::__cxx11::string(&)(cs_impl::any_const&)>((cs *)&local_2a8,type_abi_cxx11_,true);
  pdVar2 = domain_manager::add_buildin_var<char_const(&)[5]>
                     (pdVar2,(char (*) [5])0x2f6771,&local_2a8);
  make_cni<cs_impl::any(&)(cs_impl::any_const&)>((cs *)&local_2b0,clone,false);
  pdVar2 = domain_manager::add_buildin_var<char_const(&)[6]>
                     (pdVar2,(char (*) [6])"clone",&local_2b0);
  make_cni<cs_impl::any(&)(cs_impl::any_const&)>((cs *)&local_2b8,move,false);
  pdVar2 = domain_manager::add_buildin_var<char_const(&)[5]>
                     (pdVar2,(char (*) [5])0x2f7698,&local_2b8);
  make_cni<void(&)(cs_impl::any&,cs_impl::any&)>((cs *)&local_2c0,swap,true);
  pdVar2 = domain_manager::add_buildin_var<char_const(&)[5]>(pdVar2,(char (*) [5])"swap",&local_2c0)
  ;
  make_cni<bool(&)(cs::type_id_const&,cs::type_id_const&)>((cs *)&local_2c8,is_a,true);
  pdVar2 = domain_manager::add_buildin_var<char_const(&)[5]>(pdVar2,(char (*) [5])"is_a",&local_2c8)
  ;
  cs_impl::any::make_protect<std::shared_ptr<cs::name_space>,std::shared_ptr<cs::name_space>const&>
            (&local_2d0,(shared_ptr<cs::name_space> *)&cs_impl::except_ext);
  pdVar2 = domain_manager::add_buildin_var<char_const(&)[10]>
                     (pdVar2,(char (*) [10])0x2fb96b,&local_2d0);
  cs_impl::any::make_protect<std::shared_ptr<cs::name_space>,std::shared_ptr<cs::name_space>const&>
            (&local_2d8,(shared_ptr<cs::name_space> *)&cs_impl::iostream_ext);
  pdVar2 = domain_manager::add_buildin_var<char_const(&)[9]>
                     (pdVar2,(char (*) [9])"iostream",&local_2d8);
  cs_impl::any::make_protect<std::shared_ptr<cs::name_space>,std::shared_ptr<cs::name_space>const&>
            (&local_2e0,(shared_ptr<cs::name_space> *)&cs_impl::system_ext);
  pdVar2 = domain_manager::add_buildin_var<char_const(&)[7]>
                     (pdVar2,(char (*) [7])"system",&local_2e0);
  cs_impl::any::make_protect<std::shared_ptr<cs::name_space>,std::shared_ptr<cs::name_space>const&>
            (&local_2e8,(shared_ptr<cs::name_space> *)&cs_impl::runtime_ext);
  pdVar2 = domain_manager::add_buildin_var<char_const(&)[8]>
                     (pdVar2,(char (*) [8])"runtime",&local_2e8);
  cs_impl::any::make_protect<std::shared_ptr<cs::name_space>,std::shared_ptr<cs::name_space>const&>
            (&local_2f0,(shared_ptr<cs::name_space> *)&cs_impl::math_ext);
  domain_manager::add_buildin_var<char_const(&)[5]>(pdVar2,(char (*) [5])"math",&local_2f0);
  cs_impl::any::recycle(&local_2f0);
  cs_impl::any::recycle(&local_2e8);
  cs_impl::any::recycle(&local_2e0);
  cs_impl::any::recycle(&local_2d8);
  cs_impl::any::recycle(&local_2d0);
  cs_impl::any::recycle(&local_2c8);
  cs_impl::any::recycle(&local_2c0);
  cs_impl::any::recycle(&local_2b8);
  cs_impl::any::recycle(&local_2b0);
  cs_impl::any::recycle(&local_2a8);
  cs_impl::any::recycle(&local_2a0);
  cs_impl::any::recycle(&local_298);
  cs_impl::any::recycle(&local_290);
  cs_impl::any::recycle(&local_288);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_258._M_refcount);
  std::_Function_base::~_Function_base((_Function_base *)&local_188);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_248._M_refcount);
  std::_Function_base::~_Function_base((_Function_base *)&local_168);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_238._M_refcount);
  std::_Function_base::~_Function_base((_Function_base *)&local_148);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_228._M_refcount);
  std::_Function_base::~_Function_base((_Function_base *)&local_128);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_218._M_refcount);
  std::_Function_base::~_Function_base((_Function_base *)&local_108);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_208._M_refcount);
  std::_Function_base::~_Function_base((_Function_base *)&local_e8);
  std::_Function_base::~_Function_base((_Function_base *)&local_c8);
  std::_Function_base::~_Function_base((_Function_base *)&local_a8);
  std::_Function_base::~_Function_base((_Function_base *)&local_88);
  std::_Function_base::~_Function_base((_Function_base *)&local_68);
  std::_Function_base::~_Function_base((_Function_base *)&local_48);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1f8._M_refcount);
  std::_Function_base::~_Function_base((_Function_base *)local_278);
  cVar3.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  cVar3.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (context_t)cVar3.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

context_t create_subcontext(const context_t &cxt)
	{
		cs_impl::init_extensions();
		context_t context = std::make_shared<context_type>();
		context->instance = std::make_shared<instance_type>(context, cxt->instance->fiber_sp, current_process->stack_size);
		context->compiler = cxt->compiler;
		context->cmd_args = cxt->cmd_args;
		// Init Runtime
		context->instance->storage
		// Internal Types
		.add_buildin_type("char", []() -> var { return var::make<char>('\0'); }, typeid(char),
		                  cs_impl::char_ext)
		.add_buildin_type("number", []() -> var { return var::make<numeric>(0); }, typeid(numeric))
		.add_buildin_type("integer", []() -> var { return var::make<numeric>(0); }, typeid(numeric))
		.add_buildin_type("float", []() -> var { return var::make<numeric>(0.0); }, typeid(numeric))
		.add_buildin_type("boolean", []() -> var { return var::make<boolean>(true); }, typeid(boolean))
		.add_buildin_type("pointer", []() -> var { return var::make<pointer>(null_pointer); }, typeid(pointer))
		.add_buildin_type("string", []() -> var { return var::make<string>(); }, typeid(string),
		                  cs_impl::string_ext)
		.add_buildin_type("list", []() -> var { return var::make<list>(); }, typeid(list), cs_impl::list_ext)
		.add_buildin_type("array", []() -> var { return var::make<array>(); }, typeid(array),
		                  cs_impl::array_ext)
		.add_buildin_type("pair", []() -> var { return var::make<pair>(numeric(0), numeric(0)); }, typeid(pair),
		                  cs_impl::pair_ext)
		.add_buildin_type("hash_set", []() -> var { return var::make<hash_set>(); }, typeid(hash_set),
		                  cs_impl::hash_set_ext)
		.add_buildin_type("hash_map", []() -> var { return var::make<hash_map>(); }, typeid(hash_map),
		                  cs_impl::hash_map_ext)
		// Context
		.add_buildin_var("context", var::make_constant<context_t>(context))
		// Add Internal Functions to storage
		.add_buildin_var("range", var::make_protect<callable>(range, callable::types::request_fold))
		.add_buildin_var("to_integer", make_cni(to_integer, true))
		.add_buildin_var("to_string", make_cni(to_string, true))
		.add_buildin_var("type", make_cni(type, true))
		.add_buildin_var("clone", make_cni(clone))
		.add_buildin_var("move", make_cni(move))
		.add_buildin_var("swap", make_cni(swap, true))
		.add_buildin_var("is_a", make_cni(is_a, true))
		// Add extensions to storage
		.add_buildin_var("exception", make_namespace(cs_impl::except_ext))
		.add_buildin_var("iostream", make_namespace(cs_impl::iostream_ext))
		.add_buildin_var("system", make_namespace(cs_impl::system_ext))
		.add_buildin_var("runtime", make_namespace(cs_impl::runtime_ext))
		.add_buildin_var("math", make_namespace(cs_impl::math_ext));
		return context;
	}